

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

bool folded_normal_check(double a,double b)

{
  double b_local;
  double a_local;
  
  if (0.0 <= a) {
    if (0.0 < b) {
      a_local._7_1_ = true;
    }
    else {
      std::operator<<((ostream *)&std::cerr," \n");
      std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CHECK - Warning!\n");
      std::operator<<((ostream *)&std::cerr,"  B <= 0.\n");
      a_local._7_1_ = false;
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr," \n");
    std::operator<<((ostream *)&std::cerr,"FOLDED_NORMAL_CHECK - Warning!\n");
    std::operator<<((ostream *)&std::cerr,"  A < 0.\n");
    a_local._7_1_ = false;
  }
  return a_local._7_1_;
}

Assistant:

bool folded_normal_check ( double a, double b )

//****************************************************************************80
//
//  Purpose:
//
//    FOLDED_NORMAL_CHECK checks the parameters of the Folded Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, B, the parameters of the PDF.
//    0.0 <= A,
//    0.0 < B.
//
//    Output, bool FOLDED_NORMAL_CHECK, is true if the parameters are legal.
//
{
  if ( a < 0.0 )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CHECK - Warning!\n";
    cerr << "  A < 0.\n";
    return false;
  }

  if ( b <= 0.0 )
  {
    cerr << " \n";
    cerr << "FOLDED_NORMAL_CHECK - Warning!\n";
    cerr << "  B <= 0.\n";
    return false;
  }

  return true;
}